

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int X509V3_NAME_from_section(X509_NAME *nm,stack_st_CONF_VALUE *dn_sk,ulong chtype)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  if (nm == (X509_NAME *)0x0) {
    return 0;
  }
  sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)dn_sk);
  if (sVar5 == 0) {
    uVar4 = 1;
  }
  else {
    sVar5 = 0;
    do {
      pvVar6 = OPENSSL_sk_value((OPENSSL_STACK *)dn_sk,sVar5);
      pbVar8 = *(byte **)((long)pvVar6 + 8);
      pbVar2 = pbVar8;
      do {
        while( true ) {
          pbVar9 = pbVar2 + 1;
          bVar1 = *pbVar2;
          pbVar2 = pbVar9;
          if (bVar1 < 0x2e) break;
          if ((bVar1 == 0x3a) || (bVar1 == 0x2e)) goto LAB_0021c636;
        }
        if (bVar1 == 0) goto LAB_0021c63d;
      } while (bVar1 != 0x2c);
LAB_0021c636:
      if (*pbVar9 != 0) {
        pbVar8 = pbVar9;
      }
LAB_0021c63d:
      iVar3 = X509_NAME_add_entry_by_txt
                        (nm,(char *)(pbVar8 + (*pbVar8 == 0x2b)),(int)chtype,
                         *(uchar **)((long)pvVar6 + 0x10),-1,-1,-(uint)(*pbVar8 == 0x2b));
      if (iVar3 == 0) break;
      sVar5 = sVar5 + 1;
      sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)dn_sk);
    } while (sVar5 < sVar7);
    uVar4 = (uint)(iVar3 != 0);
  }
  return uVar4;
}

Assistant:

int X509V3_NAME_from_section(X509_NAME *nm, const STACK_OF(CONF_VALUE) *dn_sk,
                             int chtype) {
  if (!nm) {
    return 0;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(dn_sk); i++) {
    const CONF_VALUE *v = sk_CONF_VALUE_value(dn_sk, i);
    const char *type = v->name;
    // Skip past any leading X. X: X, etc to allow for multiple instances
    for (const char *p = type; *p; p++) {
      if ((*p == ':') || (*p == ',') || (*p == '.')) {
        p++;
        if (*p) {
          type = p;
        }
        break;
      }
    }
    int mval;
    if (*type == '+') {
      mval = -1;
      type++;
    } else {
      mval = 0;
    }
    if (!X509_NAME_add_entry_by_txt(nm, type, chtype, (unsigned char *)v->value,
                                    -1, -1, mval)) {
      return 0;
    }
  }
  return 1;
}